

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_serial_gets(char *buf,size_t size,mbedtls_x509_buf *serial)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong __maxlen;
  bool bVar6;
  
  uVar5 = serial->len;
  uVar3 = 0x1c;
  if (uVar5 < 0x21) {
    uVar3 = uVar5;
  }
  __maxlen = size;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      if ((uVar5 != 0 || uVar3 == 1) || (*serial->p != '\0')) {
        pcVar4 = anon_var_dwarf_1255b + 9;
        if (uVar5 < uVar3 - 1) {
          pcVar4 = ":";
        }
        uVar1 = snprintf(buf,__maxlen,"%02X%s",(ulong)serial->p[uVar5],pcVar4);
        if ((int)uVar1 < 0) {
          return -0x2980;
        }
        uVar2 = (ulong)uVar1;
        bVar6 = __maxlen < uVar2;
        __maxlen = __maxlen - uVar2;
        if (bVar6 || __maxlen == 0) {
          return -0x2980;
        }
        buf = buf + uVar2;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    uVar5 = serial->len;
  }
  if (uVar3 != uVar5) {
    uVar1 = snprintf(buf,__maxlen,"....");
    if ((int)uVar1 < 0) {
      return -0x2980;
    }
    bVar6 = __maxlen < uVar1;
    __maxlen = __maxlen - uVar1;
    if (bVar6 || __maxlen == 0) {
      return -0x2980;
    }
  }
  return (int)size - (int)__maxlen;
}

Assistant:

int mbedtls_x509_serial_gets( char *buf, size_t size, const mbedtls_x509_buf *serial )
{
    int ret;
    size_t i, n, nr;
    char *p;

    p = buf;
    n = size;

    nr = ( serial->len <= 32 )
        ? serial->len  : 28;

    for( i = 0; i < nr; i++ )
    {
        if( i == 0 && nr > 1 && serial->p[i] == 0x0 )
            continue;

        ret = mbedtls_snprintf( p, n, "%02X%s",
                serial->p[i], ( i < nr - 1 ) ? ":" : "" );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }

    if( nr != serial->len )
    {
        ret = mbedtls_snprintf( p, n, "...." );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }

    return( (int) ( size - n ) );
}